

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O0

int main(int argc,char **argv)

{
  j1939cat_priv *priv_00;
  undefined8 in_RSI;
  undefined4 in_EDI;
  int ret;
  j1939cat_priv *priv;
  int local_1c;
  int argc_00;
  undefined4 uVar1;
  
  argc_00 = (int)((ulong)in_RSI >> 0x20);
  uVar1 = 0;
  priv_00 = (j1939cat_priv *)calloc(1,0xb0);
  if (priv_00 == (j1939cat_priv *)0x0) {
    err(1,"can\'t allocate priv");
  }
  priv_00->todo_prio = -1;
  priv_00->infile = 0;
  priv_00->outfile = 1;
  priv_00->max_transfer = 0x6fffff9;
  priv_00->polltimeout = 100000;
  priv_00->repeat = 1;
  j1939cat_init_sockaddr_can(&priv_00->sockname);
  j1939cat_init_sockaddr_can(&priv_00->peername);
  local_1c = j1939cat_parse_args((j1939cat_priv *)CONCAT44(uVar1,in_EDI),argc_00,(char **)priv_00);
  if ((local_1c == 0) &&
     (local_1c = j1939cat_sock_prepare((j1939cat_priv *)CONCAT44(uVar1,in_EDI)), local_1c == 0)) {
    if ((priv_00->todo_recv & 1U) == 0) {
      local_1c = j1939cat_send(priv_00);
    }
    else {
      local_1c = j1939cat_recv((j1939cat_priv *)CONCAT44(uVar1,in_EDI));
    }
    close(priv_00->infile);
    close(priv_00->outfile);
    close(priv_00->sock);
  }
  return local_1c;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939cat_priv *priv;
	int ret = 0;

	priv = calloc(1, sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	priv->todo_prio = -1;
	priv->infile = STDIN_FILENO;
	priv->outfile = STDOUT_FILENO;
	priv->max_transfer = J1939_MAX_ETP_PACKET_SIZE;
	priv->polltimeout = 100000;
	priv->repeat = 1;

	j1939cat_init_sockaddr_can(&priv->sockname);
	j1939cat_init_sockaddr_can(&priv->peername);

	ret = j1939cat_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	ret = j1939cat_sock_prepare(priv);
	if (ret)
		return ret;

	if (priv->todo_recv)
		ret = j1939cat_recv(priv);
	else
		ret = j1939cat_send(priv);

	close(priv->infile);
	close(priv->outfile);
	close(priv->sock);

	return ret;
}